

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

void __thiscall
duckdb::Relation::Create
          (Relation *this,string *schema_name,string *table_name,bool temporary,
          OnCreateConflict on_conflict)

{
  pointer pQVar1;
  pointer *__ptr;
  shared_ptr<duckdb::Relation,_true> create;
  string prepended_message;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  CreateRel((Relation *)local_60,(string *)this,schema_name,SUB81(table_name,0),temporary);
  shared_ptr<duckdb::Relation,_true>::operator->((shared_ptr<duckdb::Relation,_true> *)local_60);
  Execute((Relation *)&local_68);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_68);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    if (local_68._M_head_impl != (QueryResult *)0x0) {
      (*((local_68._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    return;
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60 + 0x10),"Failed to create table \'",table_name);
  ::std::operator+(&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60 + 0x10),"\': ");
  ::std::__cxx11::string::~string((string *)(local_60 + 0x10));
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_68);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,&local_30);
}

Assistant:

void Relation::Create(const string &schema_name, const string &table_name, bool temporary,
                      OnCreateConflict on_conflict) {
	auto create = CreateRel(schema_name, table_name, temporary, on_conflict);
	auto res = create->Execute();
	if (res->HasError()) {
		const string prepended_message = "Failed to create table '" + table_name + "': ";
		res->ThrowError(prepended_message);
	}
}